

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void TrimInitialSpace(TidyDocImpl *doc,Node *element,Node *text)

{
  uint uVar1;
  long lVar2;
  Bool BVar3;
  Node *pNVar4;
  
  BVar3 = prvTidynodeIsText(text);
  if (((BVar3 != no) && (*(char *)(*(long *)&(doc->root).linebreak + (ulong)text->start) == ' ')) &&
     (text->start < text->end)) {
    if ((element->tag->model & 0x410) == 0x10) {
      pNVar4 = element->prev;
      BVar3 = prvTidynodeIsText(pNVar4);
      if (BVar3 == no) {
        pNVar4 = prvTidyNewNode((TidyAllocator *)(doc->config).value[6].p,(Lexer *)doc);
        uVar1 = element->start;
        element->start = uVar1 + 1;
        pNVar4->start = uVar1;
        pNVar4->end = element->start;
        *(undefined1 *)(*(long *)&(doc->root).linebreak + (ulong)uVar1) = 0x20;
        prvTidyInsertNodeBeforeElement(element,pNVar4);
      }
      else {
        uVar1 = pNVar4->end;
        lVar2 = *(long *)&(doc->root).linebreak;
        if (((ulong)uVar1 == 0) || (*(char *)(lVar2 + (ulong)(uVar1 - 1)) != ' ')) {
          pNVar4->end = uVar1 + 1;
          *(undefined1 *)(lVar2 + (ulong)uVar1) = 0x20;
        }
        element->start = element->start + 1;
      }
    }
    text->start = text->start + 1;
  }
  return;
}

Assistant:

static void TrimInitialSpace( TidyDocImpl* doc, Node *element, Node *text )
{
    Lexer* lexer = doc->lexer;
    Node *prev, *node;

    if ( TY_(nodeIsText)(text) &&
         lexer->lexbuf[text->start] == ' ' &&
         text->start < text->end )
    {
        if ( (element->tag->model & CM_INLINE) &&
             !(element->tag->model & CM_FIELD) )
        {
            prev = element->prev;

            if (TY_(nodeIsText)(prev))
            {
                if (prev->end == 0 || lexer->lexbuf[prev->end - 1] != ' ')
                    lexer->lexbuf[(prev->end)++] = ' ';

                ++(element->start);
            }
            else /* create new node */
            {
                node = TY_(NewNode)(lexer->allocator, lexer);
                node->start = (element->start)++;
                node->end = element->start;
                lexer->lexbuf[node->start] = ' ';
                TY_(InsertNodeBeforeElement)(element ,node);
                DEBUG_LOG(SPRTF("TrimInitialSpace: Created text node, inserted before <%s>\n",
                    (element->element ? element->element : "unknown")));
            }
        }

        /* discard the space in current node */
        ++(text->start);
    }
}